

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

uint32_t array_container_rank_many
                   (array_container_t *arr,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ulong in_RAX;
  uint uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t *puVar8;
  uint64_t in_R10;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  
  puVar8 = begin;
  if (begin != end) {
    uVar2 = *begin;
    uVar9 = 0;
    do {
      uVar4 = *puVar8 ^ uVar2;
      if (uVar4 < 0x10000) {
        uVar11 = (ulong)uVar9;
        iVar10 = ~uVar9 + arr->cardinality;
        uVar7 = 0;
        do {
          if (iVar10 < (int)uVar7) {
            uVar6 = ~uVar7;
            break;
          }
          uVar6 = uVar7 + iVar10 >> 1;
          uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar7 + iVar10 & 0xfffffffe) + uVar11 * 2);
          uVar5 = (ushort)*puVar8;
          if (uVar1 < uVar5) {
            uVar7 = uVar6 + 1;
            bVar3 = true;
          }
          else if (uVar5 < uVar1) {
            iVar10 = uVar6 - 1;
            bVar3 = true;
          }
          else {
            bVar3 = false;
            in_R10 = (uint64_t)uVar6;
          }
          uVar6 = (uint)in_R10;
        } while (bVar3);
        uVar7 = ~uVar6;
        if (-1 < (int)uVar6) {
          uVar7 = uVar6 + 1;
        }
        if (-1 < (int)uVar6) {
          uVar9 = uVar6 + 1;
        }
        in_R10 = (ulong)uVar7 + uVar11 + start_rank;
        *ans = in_R10;
        ans = ans + 1;
      }
      else {
        in_RAX = (ulong)((long)puVar8 - (long)begin) >> 2;
      }
      if (0xffff < uVar4) {
        return (uint32_t)in_RAX;
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != end);
  }
  return (uint32_t)((ulong)((long)puVar8 - (long)begin) >> 2);
}

Assistant:

inline uint32_t array_container_rank_many(const array_container_t *arr,
                                          uint64_t start_rank,
                                          const uint32_t *begin,
                                          const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    uint32_t pos = 0;
    const uint32_t *iter = begin;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        const int32_t idx =
            binarySearch(arr->array + pos, arr->cardinality - pos, (uint16_t)x);
        const bool is_present = idx >= 0;
        if (is_present) {
            *(ans++) = start_rank + pos + (idx + 1);
            pos = idx + 1;
        } else {
            *(ans++) = start_rank + pos + (-idx - 1);
        }
    }
    return iter - begin;
}